

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O1

void XmlReporter__will_report_beginning_and_successful_finishing_of_passing_test(void)

{
  char *pcVar1;
  Constraint *pCVar2;
  size_t actual;
  va_list null_arguments;
  __va_list_tag local_48;
  
  local_48.gp_offset = 0;
  local_48.fp_offset = 0;
  local_48.overflow_arg_area = (void *)0x0;
  local_48.reg_save_area = (void *)0x0;
  (*reporter->start_test)(reporter,"test_name");
  pcVar1 = output;
  pCVar2 = (Constraint *)
           create_begins_with_string_constraint
                     ("<testcase classname=\"\"","\"<testcase classname=\\\"\\\"\"");
  cgreen::assert_that_<char*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
             ,0x68,"output",pcVar1,pCVar2);
  pcVar1 = output;
  pCVar2 = (Constraint *)
           create_contains_string_constraint("name=\"test_name\"","\"name=\\\"test_name\\\"\"");
  cgreen::assert_that_<char*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
             ,0x69,"output",pcVar1,pCVar2);
  clear_output();
  (*reporter->show_pass)(reporter,"file",2,"test_name",&local_48);
  actual = strlen(output);
  pCVar2 = (Constraint *)create_equal_to_value_constraint(0,"0");
  cgreen::assert_that_<unsigned_long>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
             ,0x6e,"strlen(output)",actual,pCVar2);
  (*reporter->finish_test)(reporter,"filename",0x29a,(char *)0x0);
  pcVar1 = output;
  pCVar2 = (Constraint *)create_contains_string_constraint("</testcase>","\"</testcase>\"");
  cgreen::assert_that_<char*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
             ,0x71,"output",pcVar1,pCVar2);
  return;
}

Assistant:

static void setup_xml_reporter_tests(void) {
    reporter = create_xml_reporter("PREFIX");

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(667);

    clear_output();
    set_xml_reporter_printer(reporter, mocked_printf);
}